

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::ensure_valid_name
          (string *__return_storage_ptr__,CompilerMSL *this,string *name,string *pfx)

{
  char *pcVar1;
  
  if (((name->_M_string_length < 2) || (pcVar1 = (name->_M_dataplus)._M_p, *pcVar1 != '_')) ||
     (9 < (int)pcVar1[1] - 0x30U)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    ::std::operator+(__return_storage_ptr__,pfx,name);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::ensure_valid_name(string name, string pfx)
{
	return (name.size() >= 2 && name[0] == '_' && isdigit(name[1])) ? (pfx + name) : name;
}